

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_set_provider(Curl_easy *data,char *iname)

{
  undefined1 *puVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  ulong error;
  char *iname_local;
  Curl_str prov;
  char name [129];
  char error_buffer [256];
  
  iname_local = iname;
  if (iname == (char *)0x0) {
    ossl_provider_cleanup(data);
  }
  else {
    iVar2 = Curl_str_until(&iname_local,&prov,0x80,':');
    if (iVar2 != 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    iVar2 = Curl_str_single(&iname_local,':');
    pcVar4 = iname_local;
    if (iVar2 != 0) {
      pcVar4 = (char *)0x0;
    }
    memcpy(name,prov.str,prov.len);
    name[prov.len] = '\0';
    pvVar3 = (data->state).libctx;
    if (pvVar3 == (void *)0x0) {
      pvVar3 = (void *)OSSL_LIB_CTX_new();
      if (pvVar3 == (void *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      if (pcVar4 != (char *)0x0) {
        pcVar4 = (*Curl_cstrdup)(pcVar4);
        (data->state).propq = pcVar4;
        if (pcVar4 == (char *)0x0) {
          OSSL_LIB_CTX_free(pvVar3);
          return CURLE_OUT_OF_MEMORY;
        }
      }
      (data->state).libctx = pvVar3;
    }
    iVar2 = OSSL_PROVIDER_available(pvVar3,name);
    if (iVar2 == 0) {
      pvVar3 = (void *)OSSL_PROVIDER_try_load((data->state).libctx,name,1);
      (data->state).provider = pvVar3;
      if (pvVar3 == (void *)0x0) {
        error = ERR_get_error();
        pcVar4 = ossl_strerror(error,error_buffer,0x100);
        Curl_failf(data,"Failed to initialize provider: %s",pcVar4);
        ossl_provider_cleanup(data);
        return CURLE_SSL_ENGINE_NOTFOUND;
      }
      pvVar3 = (void *)OSSL_PROVIDER_try_load((data->state).libctx,"base",1);
      (data->state).baseprov = pvVar3;
      if (pvVar3 == (void *)0x0) {
        ossl_provider_cleanup(data);
        Curl_failf(data,"Failed to load base");
        return CURLE_SSL_ENGINE_NOTFOUND;
      }
    }
    puVar1 = &(data->state).field_0x188;
    *puVar1 = *puVar1 | 1;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_set_provider(struct Curl_easy *data, const char *iname)
{
  char name[MAX_PROVIDER_LEN + 1];
  struct Curl_str prov;
  const char *propq = NULL;

  if(!iname) {
    /* clear and cleanup provider use */
    ossl_provider_cleanup(data);
    return CURLE_OK;
  }
  if(Curl_str_until(&iname, &prov, MAX_PROVIDER_LEN, ':'))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(!Curl_str_single(&iname, ':'))
    /* there was a colon, get the propq until the end of string */
    propq = iname;

  /* we need the name in a buffer, null-terminated */
  memcpy(name, Curl_str(&prov), Curl_strlen(&prov));
  name[Curl_strlen(&prov)] = 0;

  if(!data->state.libctx) {
    OSSL_LIB_CTX *libctx = OSSL_LIB_CTX_new();
    if(!libctx)
      return CURLE_OUT_OF_MEMORY;
    if(propq) {
      data->state.propq = strdup(propq);
      if(!data->state.propq) {
        OSSL_LIB_CTX_free(libctx);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    data->state.libctx = libctx;
  }

  if(OSSL_PROVIDER_available(data->state.libctx, name)) {
    /* already loaded through the configuration - no action needed */
    data->state.provider_loaded = TRUE;
    return CURLE_OK;
  }

  data->state.provider =
    OSSL_PROVIDER_try_load(data->state.libctx, name, 1);
  if(!data->state.provider) {
    char error_buffer[256];
    failf(data, "Failed to initialize provider: %s",
          ossl_strerror(ERR_get_error(), error_buffer,
                        sizeof(error_buffer)));
    ossl_provider_cleanup(data);
    return CURLE_SSL_ENGINE_NOTFOUND;
  }

  /* load the base provider as well */
  data->state.baseprov =
    OSSL_PROVIDER_try_load(data->state.libctx, "base", 1);
  if(!data->state.baseprov) {
    ossl_provider_cleanup(data);
    failf(data, "Failed to load base");
    return CURLE_SSL_ENGINE_NOTFOUND;
  }
  else
    data->state.provider_loaded = TRUE;
  return CURLE_OK;
}